

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PretransformVertices.cpp
# Opt level: O2

void __thiscall Assimp::PretransformVertices::Execute(PretransformVertices *this,aiScene *pScene)

{
  uint *s_00;
  char *pcVar1;
  aiMesh *paVar2;
  aiBone **ppaVar3;
  aiBone *this_00;
  aiAnimation **ppaVar4;
  aiAnimation *this_01;
  aiCamera *paVar5;
  aiLight *paVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  pointer __src;
  bool bVar18;
  uint i_2;
  uint uVar19;
  Logger *pLVar20;
  aiMesh **__dest;
  uint this_02 [2];
  ulong *puVar21;
  aiVector3D *paVar22;
  aiColor4D *__s;
  uint *s_01;
  aiNode *paVar23;
  uint *s_02;
  aiNode *paVar24;
  uint *puVar25;
  ostream *poVar26;
  aiNode **ppaVar27;
  DeadlyImportError *this_03;
  uint a_1;
  aiFace *paVar28;
  uint i;
  uint i_6;
  uint uVar29;
  PretransformVertices *pPVar30;
  PretransformVertices *pPVar31;
  uint uVar32;
  uint a;
  ulong uVar33;
  long lVar34;
  uint i_1;
  ulong uVar35;
  size_t sVar36;
  aiMatrix4x4 *paVar37;
  uint i_4;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  aiVector3t<float> aVar42;
  uint local_22c;
  uint iVertices;
  float local_220;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> apcOutMeshes;
  list<unsigned_int,_std::allocator<unsigned_int>_> aiVFormats;
  vector<unsigned_int,_std::allocator<unsigned_int>_> s;
  uint aiTemp [2];
  float local_1a0;
  
  pLVar20 = DefaultLogger::get();
  Logger::debug(pLVar20,"PretransformVerticesProcess begin");
  if (pScene->mNumMeshes == 0) {
    return;
  }
  paVar23 = pScene->mRootNode;
  CountNodes(this,paVar23);
  if (this->configTransform == true) {
    fVar14 = (this->configTransformation).a1;
    fVar15 = (this->configTransformation).a2;
    fVar16 = (this->configTransformation).a3;
    fVar17 = (this->configTransformation).a4;
    fVar10 = (this->configTransformation).b1;
    fVar11 = (this->configTransformation).b2;
    fVar12 = (this->configTransformation).b3;
    fVar13 = (this->configTransformation).b4;
    fVar41 = (this->configTransformation).c1;
    fVar7 = (this->configTransformation).c2;
    fVar8 = (this->configTransformation).c3;
    fVar9 = (this->configTransformation).c4;
    fVar38 = (this->configTransformation).d2;
    fVar39 = (this->configTransformation).d3;
    fVar40 = (this->configTransformation).d4;
    (paVar23->mTransformation).d1 = (this->configTransformation).d1;
    (paVar23->mTransformation).d2 = fVar38;
    (paVar23->mTransformation).d3 = fVar39;
    (paVar23->mTransformation).d4 = fVar40;
    (paVar23->mTransformation).c1 = fVar41;
    (paVar23->mTransformation).c2 = fVar7;
    (paVar23->mTransformation).c3 = fVar8;
    (paVar23->mTransformation).c4 = fVar9;
    (paVar23->mTransformation).b1 = fVar10;
    (paVar23->mTransformation).b2 = fVar11;
    (paVar23->mTransformation).b3 = fVar12;
    (paVar23->mTransformation).b4 = fVar13;
    (paVar23->mTransformation).a1 = fVar14;
    (paVar23->mTransformation).a2 = fVar15;
    (paVar23->mTransformation).a3 = fVar16;
    (paVar23->mTransformation).a4 = fVar17;
    paVar23 = pScene->mRootNode;
  }
  s_00 = &pScene->mNumMeshes;
  ComputeAbsoluteTransform(this,paVar23);
  for (uVar35 = 0; uVar35 < *s_00; uVar35 = uVar35 + 1) {
    paVar2 = pScene->mMeshes[uVar35];
    for (uVar33 = 0; ppaVar3 = paVar2->mBones, uVar33 < paVar2->mNumBones; uVar33 = uVar33 + 1) {
      this_00 = ppaVar3[uVar33];
      if (this_00 != (aiBone *)0x0) {
        aiBone::~aiBone(this_00);
      }
      operator_delete(this_00);
    }
    if (ppaVar3 != (aiBone **)0x0) {
      operator_delete__(ppaVar3);
    }
    paVar2->mBones = (aiBone **)0x0;
  }
  apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (this->configKeepHierarchy == false) {
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve
              (&apcOutMeshes,(ulong)(pScene->mNumMaterials * 2));
    aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)&aiVFormats;
    aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node._M_size
         = 0;
    aiTemp = (uint  [2])((ulong)aiTemp & 0xffffffff00000000);
    aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
    super__List_node_base._M_prev =
         aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
         super__List_node_base._M_next;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&s,(ulong)*s_00,aiTemp,(allocator_type *)&iVertices);
    BuildMeshRefCountArray
              (this,pScene->mRootNode,
               s.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start);
    for (uVar19 = 0; pPVar30 = (PretransformVertices *)&aiVFormats, uVar19 < pScene->mNumMaterials;
        uVar19 = uVar19 + 1) {
      pPVar31 = pPVar30;
      std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::clear
                ((list<unsigned_int,_std::allocator<unsigned_int>_> *)pPVar30);
      GetVFormatList(pPVar31,pScene,uVar19,
                     (list<unsigned_int,_std::allocator<unsigned_int>_> *)pPVar30);
      std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::sort
                ((list<unsigned_int,_std::allocator<unsigned_int>_> *)pPVar30);
      std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::unique
                ((list<unsigned_int,_std::allocator<unsigned_int>_> *)pPVar30);
      while (pPVar30 = (PretransformVertices *)
                       (((_List_impl *)&(pPVar30->super_BaseProcess)._vptr_BaseProcess)->_M_node).
                       super__List_node_base._M_next, pPVar30 != (PretransformVertices *)&aiVFormats
            ) {
        _iVertices = _iVertices & 0xffffffff00000000;
        local_22c = 0;
        CountVerticesAndFaces
                  (this,pScene,pScene->mRootNode,uVar19,
                   *(uint *)&(pPVar30->super_BaseProcess).progress,&local_22c,&iVertices);
        uVar35 = _iVertices;
        uVar29 = local_22c;
        uVar33 = (ulong)local_22c;
        uVar32 = iVertices;
        if (iVertices != 0 && uVar33 != 0) {
          this_02 = (uint  [2])operator_new(0x520);
          aiMesh::aiMesh((aiMesh *)this_02);
          aiTemp = this_02;
          std::vector<aiMesh*,std::allocator<aiMesh*>>::emplace_back<aiMesh*>
                    ((vector<aiMesh*,std::allocator<aiMesh*>> *)&apcOutMeshes,(aiMesh **)aiTemp);
          paVar2 = apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1];
          paVar2->mNumFaces = uVar29;
          paVar2->mNumVertices = uVar32;
          puVar21 = (ulong *)operator_new__(uVar33 * 0x10 + 8);
          *puVar21 = uVar33;
          paVar28 = (aiFace *)(puVar21 + 1);
          do {
            paVar28->mNumIndices = 0;
            paVar28->mIndices = (uint *)0x0;
            paVar28 = paVar28 + 1;
          } while (paVar28 != (aiFace *)(puVar21 + uVar33 * 2 + 1));
          paVar2->mFaces = (aiFace *)(puVar21 + 1);
          uVar33 = (uVar35 & 0xffffffff) * 0xc;
          paVar22 = (aiVector3D *)operator_new__(uVar33);
          sVar36 = ((uVar33 - 0xc) - (uVar33 - 0xc) % 0xc) + 0xc;
          memset(paVar22,0,sVar36);
          paVar2->mVertices = paVar22;
          paVar2->mMaterialIndex = uVar19;
          uVar29 = *(uint *)&(pPVar30->super_BaseProcess).progress;
          if ((uVar29 & 2) != 0) {
            paVar22 = (aiVector3D *)operator_new__(uVar33);
            memset(paVar22,0,sVar36);
            paVar2->mNormals = paVar22;
            uVar29 = *(uint *)&(pPVar30->super_BaseProcess).progress;
          }
          if ((uVar29 & 4) != 0) {
            paVar22 = (aiVector3D *)operator_new__(uVar33);
            memset(paVar22,0,sVar36);
            paVar2->mTangents = paVar22;
            paVar22 = (aiVector3D *)operator_new__(uVar33);
            memset(paVar22,0,sVar36);
            paVar2->mBitangents = paVar22;
          }
          uVar29 = 0;
          while( true ) {
            uVar32 = *(uint *)&(pPVar30->super_BaseProcess).progress;
            if (((uVar32 >> ((byte)uVar29 & 0x1f)) >> 8 & 1) == 0) break;
            paVar22 = (aiVector3D *)operator_new__(uVar33);
            memset(paVar22,0,sVar36);
            paVar2->mTextureCoords[uVar29] = paVar22;
            paVar2->mNumUVComponents[uVar29] =
                 (((*(uint *)&(pPVar30->super_BaseProcess).progress >> ((byte)uVar29 & 0x1f)) >>
                   0x10 & 1) != 0) + 2;
            uVar29 = uVar29 + 1;
          }
          uVar33 = (uVar35 & 0xffffffff) << 4;
          uVar35 = 0;
          while (((uVar32 >> ((byte)uVar35 & 0x1f)) >> 0x18 & 1) != 0) {
            __s = (aiColor4D *)operator_new__(uVar33);
            memset(__s,0,uVar33);
            paVar2->mColors[uVar35] = __s;
            uVar35 = (ulong)((int)uVar35 + 1);
            uVar32 = *(uint *)&(pPVar30->super_BaseProcess).progress;
          }
          aiTemp[0] = 0;
          aiTemp[1] = 0;
          CollectData(this,pScene,pScene->mRootNode,uVar19,uVar32,paVar2,aiTemp,
                      s.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
        }
      }
    }
    if (apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      this_03 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)aiTemp,
                 "No output meshes: all meshes are orphaned and are not referenced by any nodes",
                 (allocator *)&iVertices);
      DeadlyImportError::DeadlyImportError(this_03,(string *)aiTemp);
      __cxa_throw(this_03,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    for (uVar35 = 0; uVar35 < *s_00; uVar35 = uVar35 + 1) {
      paVar2 = pScene->mMeshes[uVar35];
      paVar2->mNumBones = 0;
      paVar2->mBones = (aiBone **)0x0;
      lVar34 = 0;
      for (uVar33 = 0; uVar33 < paVar2->mNumFaces; uVar33 = uVar33 + 1) {
        *(undefined4 *)((long)&paVar2->mFaces->mNumIndices + lVar34) = 0;
        *(undefined8 *)((long)&paVar2->mFaces->mIndices + lVar34) = 0;
        lVar34 = lVar34 + 0x10;
      }
      aiMesh::~aiMesh(paVar2);
      operator_delete(paVar2);
    }
    uVar33 = (ulong)((long)apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 3;
    *s_00 = (uint)uVar33;
    for (uVar35 = 0; uVar35 < (uVar33 & 0xffffffff); uVar35 = uVar35 + 1) {
      pScene->mMeshes[uVar35] =
           apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
           super__Vector_impl_data._M_start[uVar35];
      uVar33 = (ulong)pScene->mNumMeshes;
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&s.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::__cxx11::_List_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_clear
              (&aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>);
  }
  else {
    pPVar30 = this;
    BuildWCSMeshes(this,&apcOutMeshes,pScene->mMeshes,*s_00,pScene->mRootNode);
    __src = apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_start;
    sVar36 = (long)apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if (sVar36 != 0) {
      lVar34 = (long)apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      uVar19 = *s_00;
      uVar33 = (ulong)uVar19;
      uVar35 = lVar34 + uVar33;
      __dest = (aiMesh **)operator_new__(-(ulong)(uVar35 >> 0x3d != 0) | uVar35 * 8);
      pPVar31 = (PretransformVertices *)pScene->mMeshes;
      memcpy(__dest,pPVar31,uVar33 * 8);
      pPVar30 = (PretransformVertices *)(__dest + uVar33);
      memcpy(pPVar30,__src,sVar36);
      pScene->mNumMeshes = (int)lVar34 + uVar19;
      if (pPVar31 != (PretransformVertices *)0x0) {
        operator_delete__(pPVar31);
        pPVar30 = pPVar31;
      }
      pScene->mMeshes = __dest;
    }
    for (uVar35 = 0; uVar35 < *s_00; uVar35 = uVar35 + 1) {
      ApplyTransform(pPVar30,pScene->mMeshes[uVar35],(aiMatrix4x4 *)pScene->mMeshes[uVar35]->mBones)
      ;
      pScene->mMeshes[uVar35]->mBones = (aiBone **)0x0;
      pScene->mMeshes[uVar35]->mNumBones = 0;
    }
  }
  for (uVar35 = 0; ppaVar4 = pScene->mAnimations, uVar35 < pScene->mNumAnimations;
      uVar35 = uVar35 + 1) {
    this_01 = ppaVar4[uVar35];
    if (this_01 != (aiAnimation *)0x0) {
      aiAnimation::~aiAnimation(this_01);
    }
    operator_delete(this_01);
  }
  if (ppaVar4 != (aiAnimation **)0x0) {
    operator_delete__(ppaVar4);
  }
  pScene->mAnimations = (aiAnimation **)0x0;
  pScene->mNumAnimations = 0;
  s_01 = &pScene->mNumCameras;
  for (uVar35 = 0; uVar35 < *s_01; uVar35 = uVar35 + 1) {
    paVar5 = pScene->mCameras[uVar35];
    paVar23 = aiNode::FindNode(pScene->mRootNode,(paVar5->mName).data);
    if (paVar23 == (aiNode *)0x0) {
      __assert_fail("__null != nd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/PostProcessing/PretransformVertices.cpp"
                    ,0x265,"virtual void Assimp::PretransformVertices::Execute(aiScene *)");
    }
    paVar37 = &paVar23->mTransformation;
    aVar42 = operator*(paVar37,&paVar5->mPosition);
    (paVar5->mPosition).x = (float)(int)aVar42._0_8_;
    (paVar5->mPosition).y = (float)(int)((ulong)aVar42._0_8_ >> 0x20);
    (paVar5->mPosition).z = aVar42.z;
    aiMatrix3x3t<float>::aiMatrix3x3t((aiMatrix3x3t<float> *)aiTemp,paVar37);
    aVar42 = operator*((aiMatrix3x3t<float> *)aiTemp,&paVar5->mLookAt);
    (paVar5->mLookAt).x = (float)(int)aVar42._0_8_;
    (paVar5->mLookAt).y = (float)(int)((ulong)aVar42._0_8_ >> 0x20);
    (paVar5->mLookAt).z = aVar42.z;
    aiMatrix3x3t<float>::aiMatrix3x3t((aiMatrix3x3t<float> *)aiTemp,paVar37);
    aVar42 = operator*((aiMatrix3x3t<float> *)aiTemp,&paVar5->mUp);
    (paVar5->mUp).x = (float)(int)aVar42._0_8_;
    (paVar5->mUp).y = (float)(int)((ulong)aVar42._0_8_ >> 0x20);
    (paVar5->mUp).z = aVar42.z;
  }
  s_02 = &pScene->mNumLights;
  for (uVar35 = 0; uVar35 < *s_02; uVar35 = uVar35 + 1) {
    paVar6 = pScene->mLights[uVar35];
    paVar23 = aiNode::FindNode(pScene->mRootNode,(paVar6->mName).data);
    if (paVar23 == (aiNode *)0x0) {
      __assert_fail("__null != nd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/PostProcessing/PretransformVertices.cpp"
                    ,0x272,"virtual void Assimp::PretransformVertices::Execute(aiScene *)");
    }
    paVar37 = &paVar23->mTransformation;
    aVar42 = operator*(paVar37,&paVar6->mPosition);
    (paVar6->mPosition).x = (float)(int)aVar42._0_8_;
    (paVar6->mPosition).y = (float)(int)((ulong)aVar42._0_8_ >> 0x20);
    (paVar6->mPosition).z = aVar42.z;
    aiMatrix3x3t<float>::aiMatrix3x3t((aiMatrix3x3t<float> *)aiTemp,paVar37);
    aVar42 = operator*((aiMatrix3x3t<float> *)aiTemp,&paVar6->mDirection);
    (paVar6->mDirection).x = (float)(int)aVar42._0_8_;
    (paVar6->mDirection).y = (float)(int)((ulong)aVar42._0_8_ >> 0x20);
    (paVar6->mDirection).z = aVar42.z;
    aiMatrix3x3t<float>::aiMatrix3x3t((aiMatrix3x3t<float> *)aiTemp,paVar37);
    aVar42 = operator*((aiMatrix3x3t<float> *)aiTemp,&paVar6->mUp);
    (paVar6->mUp).x = (float)(int)aVar42._0_8_;
    (paVar6->mUp).y = (float)(int)((ulong)aVar42._0_8_ >> 0x20);
    (paVar6->mUp).z = aVar42.z;
  }
  if (this->configKeepHierarchy == false) {
    paVar24 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(paVar24);
    paVar23 = pScene->mRootNode;
    if (paVar24 != paVar23) {
      uVar19 = (paVar23->mName).length;
      (paVar24->mName).length = uVar19;
      memcpy((paVar24->mName).data,(paVar23->mName).data,(ulong)uVar19);
      (paVar24->mName).data[uVar19] = '\0';
    }
    aiNode::~aiNode(paVar23);
    operator_delete(paVar23);
    pScene->mRootNode = paVar24;
    uVar19 = pScene->mNumMeshes;
    if (uVar19 == 1) {
      uVar29 = *s_01;
      if (uVar29 == 0 && pScene->mNumLights == 0) {
        paVar24->mNumMeshes = 1;
        puVar25 = (uint *)operator_new__(4);
        paVar24->mMeshes = puVar25;
        *puVar25 = 0;
        goto LAB_0014499f;
      }
    }
    else {
      uVar29 = *s_01;
    }
    uVar29 = pScene->mNumLights + uVar19 + uVar29;
    paVar24->mNumChildren = uVar29;
    ppaVar27 = (aiNode **)operator_new__((ulong)uVar29 << 3);
    paVar24->mChildren = ppaVar27;
    for (uVar35 = 0; uVar35 < uVar19; uVar35 = uVar35 + 1) {
      paVar23 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(paVar23);
      *ppaVar27 = paVar23;
      paVar23->mParent = pScene->mRootNode;
      paVar2 = pScene->mMeshes[uVar35];
      if (paVar23 != (aiNode *)&paVar2->mName) {
        uVar19 = (paVar2->mName).length;
        (paVar23->mName).length = uVar19;
        memcpy((paVar23->mName).data,(paVar2->mName).data,(ulong)uVar19);
        (paVar23->mName).data[uVar19] = '\0';
      }
      paVar23->mNumMeshes = 1;
      puVar25 = (uint *)operator_new__(4);
      paVar23->mMeshes = puVar25;
      *puVar25 = (uint)uVar35;
      ppaVar27 = ppaVar27 + 1;
      uVar19 = *s_00;
    }
    for (uVar35 = 0; uVar35 < *s_02; uVar35 = uVar35 + 1) {
      paVar24 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(paVar24);
      *ppaVar27 = paVar24;
      paVar24->mParent = pScene->mRootNode;
      pcVar1 = (paVar24->mName).data;
      uVar19 = snprintf(pcVar1,0x400,"light_%u",uVar35 & 0xffffffff);
      (paVar24->mName).length = uVar19;
      paVar23 = (aiNode *)pScene->mLights[uVar35];
      if (paVar23 != paVar24) {
        (paVar23->mName).length = uVar19;
        memcpy((paVar23->mName).data,pcVar1,(ulong)uVar19);
        (paVar23->mName).data[uVar19] = '\0';
      }
      ppaVar27 = ppaVar27 + 1;
    }
    for (uVar35 = 0; uVar35 < *s_01; uVar35 = uVar35 + 1) {
      paVar24 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(paVar24);
      ppaVar27[uVar35] = paVar24;
      paVar24->mParent = pScene->mRootNode;
      pcVar1 = (paVar24->mName).data;
      uVar19 = snprintf(pcVar1,0x400,"cam_%u",uVar35 & 0xffffffff);
      (paVar24->mName).length = uVar19;
      paVar23 = (aiNode *)pScene->mCameras[uVar35];
      if (paVar23 != paVar24) {
        (paVar23->mName).length = uVar19;
        memcpy((paVar23->mName).data,pcVar1,(ulong)uVar19);
        (paVar23->mName).data[uVar19] = '\0';
      }
    }
  }
  else {
    MakeIdentityTransform(this,pScene->mRootNode);
  }
LAB_0014499f:
  if (this->configNormalize == true) {
    fVar38 = -1e+10;
    fVar39 = -1e+10;
    aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)0xd01502f9d01502f9;
    aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
    super__List_node_base._M_prev =
         (_List_node_base *)
         CONCAT44(aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  _M_node.super__List_node_base._M_prev._4_4_,0xd01502f9);
    aiTemp[0] = 0x501502f9;
    aiTemp[1] = 0x501502f9;
    local_1a0 = 1e+10;
    fVar40 = -1e+10;
    for (uVar35 = 0; uVar33 = (ulong)*s_00, uVar35 < uVar33; uVar35 = uVar35 + 1) {
      paVar2 = pScene->mMeshes[uVar35];
      lVar34 = 0;
      for (uVar33 = 0; uVar33 < paVar2->mNumVertices; uVar33 = uVar33 + 1) {
        aVar42 = std::min<float>((aiVector3t<float> *)((long)&paVar2->mVertices->x + lVar34),
                                 (aiVector3t<float> *)aiTemp);
        local_1a0 = aVar42.z;
        aiTemp = aVar42._0_8_;
        aVar42 = std::max<float>((aiVector3t<float> *)((long)&paVar2->mVertices->x + lVar34),
                                 (aiVector3t<float> *)&aiVFormats);
        fVar40 = aVar42.z;
        fVar38 = aVar42.x;
        fVar39 = aVar42.y;
        aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
        super__List_node_base._M_next = aVar42._0_8_;
        aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
        super__List_node_base._M_prev =
             (_List_node_base *)
             CONCAT44(aiVFormats.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl._M_node.super__List_node_base._M_prev._4_4_,fVar40);
        lVar34 = lVar34 + 0xc;
      }
    }
    fVar40 = fVar40 - local_1a0;
    fVar38 = fVar38 - aiTemp[0];
    fVar39 = fVar39 - aiTemp[1];
    fVar41 = fVar40;
    if (fVar40 <= fVar39) {
      fVar41 = fVar39;
    }
    if (fVar41 <= fVar38) {
      fVar41 = fVar38;
    }
    s.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = fVar40 * 0.5 + local_1a0;
    s.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(fVar39 * 0.5 + aiTemp[1],fVar38 * 0.5 + aiTemp[0]);
    for (uVar35 = 0; uVar35 < uVar33; uVar35 = uVar35 + 1) {
      paVar2 = pScene->mMeshes[uVar35];
      lVar34 = 0;
      for (uVar33 = 0; uVar33 < paVar2->mNumVertices; uVar33 = uVar33 + 1) {
        aVar42 = operator-((aiVector3t<float> *)((long)&paVar2->mVertices->x + lVar34),
                           (aiVector3t<float> *)&s);
        local_220 = aVar42.z;
        _iVertices = aVar42._0_8_;
        aVar42 = operator/((aiVector3t<float> *)&iVertices,fVar41 * 0.5);
        paVar22 = paVar2->mVertices;
        *(long *)((long)&paVar22->x + lVar34) = aVar42._0_8_;
        *(float *)((long)&paVar22->z + lVar34) = aVar42.z;
        lVar34 = lVar34 + 0xc;
      }
      uVar33 = (ulong)*s_00;
    }
  }
  bVar18 = DefaultLogger::isNullLogger();
  if (!bVar18) {
    pLVar20 = DefaultLogger::get();
    Logger::debug(pLVar20,"PretransformVerticesProcess finished");
    pLVar20 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[9]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)aiTemp,
               (char (*) [9])0x1cf649);
    std::ostream::_M_insert<unsigned_long>((ulong)aiTemp);
    std::operator<<((ostream *)aiTemp," nodes and ");
    std::ostream::_M_insert<unsigned_long>((ulong)aiTemp);
    std::operator<<((ostream *)aiTemp," animation channels (");
    CountNodes(this,pScene->mRootNode);
    std::ostream::_M_insert<unsigned_long>((ulong)aiTemp);
    std::operator<<((ostream *)aiTemp," output nodes)");
    std::__cxx11::stringbuf::str();
    Logger::info(pLVar20,(char *)aiVFormats.
                                 super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl._M_node.super__List_node_base._M_next);
    std::__cxx11::string::~string((string *)&aiVFormats);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)aiTemp);
    pLVar20 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[6]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)aiTemp,
               (char (*) [6])"Kept ");
    poVar26 = (ostream *)
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)aiTemp,
                        s_02);
    std::operator<<(poVar26," lights and ");
    poVar26 = (ostream *)
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)poVar26
                        ,s_01);
    std::operator<<(poVar26," cameras.");
    std::__cxx11::stringbuf::str();
    Logger::info(pLVar20,(char *)aiVFormats.
                                 super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl._M_node.super__List_node_base._M_next);
    std::__cxx11::string::~string((string *)&aiVFormats);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)aiTemp);
    pLVar20 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[7]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)aiTemp,
               (char (*) [7])"Moved ");
    std::ostream::_M_insert<unsigned_long>((ulong)aiTemp);
    std::operator<<((ostream *)aiTemp," meshes to WCS (number of output meshes: ");
    poVar26 = (ostream *)
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)aiTemp,
                        s_00);
    std::operator<<(poVar26,")");
    std::__cxx11::stringbuf::str();
    Logger::info(pLVar20,(char *)aiVFormats.
                                 super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl._M_node.super__List_node_base._M_next);
    std::__cxx11::string::~string((string *)&aiVFormats);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)aiTemp);
  }
  std::_Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>::~_Vector_base
            (&apcOutMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>);
  return;
}

Assistant:

void PretransformVertices::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("PretransformVerticesProcess begin");

    // Return immediately if we have no meshes
    if (!pScene->mNumMeshes)
        return;

    const unsigned int iOldMeshes = pScene->mNumMeshes;
    const unsigned int iOldAnimationChannels = pScene->mNumAnimations;
    const unsigned int iOldNodes = CountNodes(pScene->mRootNode);

    if(configTransform) {
        pScene->mRootNode->mTransformation = configTransformation;
    }

    // first compute absolute transformation matrices for all nodes
    ComputeAbsoluteTransform(pScene->mRootNode);

    // Delete aiMesh::mBones for all meshes. The bones are
    // removed during this step and we need the pointer as
    // temporary storage
    for (unsigned int i = 0; i < pScene->mNumMeshes;++i)    {
        aiMesh* mesh = pScene->mMeshes[i];

        for (unsigned int a = 0; a < mesh->mNumBones;++a)
            delete mesh->mBones[a];

        delete[] mesh->mBones;
        mesh->mBones = NULL;
    }

    // now build a list of output meshes
    std::vector<aiMesh*> apcOutMeshes;

    // Keep scene hierarchy? It's an easy job in this case ...
    // we go on and transform all meshes, if one is referenced by nodes
    // with different absolute transformations a depth copy of the mesh
    // is required.
    if( configKeepHierarchy ) {

        // Hack: store the matrix we're transforming a mesh with in aiMesh::mBones
        BuildWCSMeshes(apcOutMeshes,pScene->mMeshes,pScene->mNumMeshes, pScene->mRootNode);

        // ... if new meshes have been generated, append them to the end of the scene
        if (apcOutMeshes.size() > 0) {
            aiMesh** npp = new aiMesh*[pScene->mNumMeshes + apcOutMeshes.size()];

            memcpy(npp,pScene->mMeshes,sizeof(aiMesh*)*pScene->mNumMeshes);
            memcpy(npp+pScene->mNumMeshes,&apcOutMeshes[0],sizeof(aiMesh*)*apcOutMeshes.size());

            pScene->mNumMeshes  += static_cast<unsigned int>(apcOutMeshes.size());
            delete[] pScene->mMeshes; pScene->mMeshes = npp;
        }

        // now iterate through all meshes and transform them to worldspace
        for (unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
            ApplyTransform(pScene->mMeshes[i],*reinterpret_cast<aiMatrix4x4*>( pScene->mMeshes[i]->mBones ));

            // prevent improper destruction
            pScene->mMeshes[i]->mBones    = NULL;
            pScene->mMeshes[i]->mNumBones = 0;
        }
    } else {
        apcOutMeshes.reserve(pScene->mNumMaterials<<1u);
        std::list<unsigned int> aiVFormats;

        std::vector<unsigned int> s(pScene->mNumMeshes,0);
        BuildMeshRefCountArray(pScene->mRootNode,&s[0]);

        for (unsigned int i = 0; i < pScene->mNumMaterials;++i)     {
            // get the list of all vertex formats for this material
            aiVFormats.clear();
            GetVFormatList(pScene,i,aiVFormats);
            aiVFormats.sort();
            aiVFormats.unique();
            for (std::list<unsigned int>::const_iterator j =  aiVFormats.begin();j != aiVFormats.end();++j) {
                unsigned int iVertices = 0;
                unsigned int iFaces = 0;
                CountVerticesAndFaces(pScene,pScene->mRootNode,i,*j,&iFaces,&iVertices);
                if (0 != iFaces && 0 != iVertices)
                {
                    apcOutMeshes.push_back(new aiMesh());
                    aiMesh* pcMesh = apcOutMeshes.back();
                    pcMesh->mNumFaces = iFaces;
                    pcMesh->mNumVertices = iVertices;
                    pcMesh->mFaces = new aiFace[iFaces];
                    pcMesh->mVertices = new aiVector3D[iVertices];
                    pcMesh->mMaterialIndex = i;
                    if ((*j) & 0x2)pcMesh->mNormals = new aiVector3D[iVertices];
                    if ((*j) & 0x4)
                    {
                        pcMesh->mTangents    = new aiVector3D[iVertices];
                        pcMesh->mBitangents  = new aiVector3D[iVertices];
                    }
                    iFaces = 0;
                    while ((*j) & (0x100 << iFaces))
                    {
                        pcMesh->mTextureCoords[iFaces] = new aiVector3D[iVertices];
                        if ((*j) & (0x10000 << iFaces))pcMesh->mNumUVComponents[iFaces] = 3;
                        else pcMesh->mNumUVComponents[iFaces] = 2;
                        iFaces++;
                    }
                    iFaces = 0;
                    while ((*j) & (0x1000000 << iFaces))
                        pcMesh->mColors[iFaces++] = new aiColor4D[iVertices];

                    // fill the mesh ...
                    unsigned int aiTemp[2] = {0,0};
                    CollectData(pScene,pScene->mRootNode,i,*j,pcMesh,aiTemp,&s[0]);
                }
            }
        }

        // If no meshes are referenced in the node graph it is possible that we get no output meshes.
        if (apcOutMeshes.empty()) {
            
            throw DeadlyImportError("No output meshes: all meshes are orphaned and are not referenced by any nodes");
        }
        else
        {
            // now delete all meshes in the scene and build a new mesh list
            for (unsigned int i = 0; i < pScene->mNumMeshes;++i)
            {
                aiMesh* mesh = pScene->mMeshes[i];
                mesh->mNumBones = 0;
                mesh->mBones    = NULL;

                // we're reusing the face index arrays. avoid destruction
                for (unsigned int a = 0; a < mesh->mNumFaces; ++a) {
                    mesh->mFaces[a].mNumIndices = 0;
                    mesh->mFaces[a].mIndices = NULL;
                }

                delete mesh;

                // Invalidate the contents of the old mesh array. We will most
                // likely have less output meshes now, so the last entries of
                // the mesh array are not overridden. We set them to NULL to
                // make sure the developer gets notified when his application
                // attempts to access these fields ...
                mesh = NULL;
            }

            // It is impossible that we have more output meshes than
            // input meshes, so we can easily reuse the old mesh array
            pScene->mNumMeshes = (unsigned int)apcOutMeshes.size();
            for (unsigned int i = 0; i < pScene->mNumMeshes;++i) {
                pScene->mMeshes[i] = apcOutMeshes[i];
            }
        }
    }

    // remove all animations from the scene
    for (unsigned int i = 0; i < pScene->mNumAnimations;++i)
        delete pScene->mAnimations[i];
    delete[] pScene->mAnimations;

    pScene->mAnimations    = NULL;
    pScene->mNumAnimations = 0;

    // --- we need to keep all cameras and lights
    for (unsigned int i = 0; i < pScene->mNumCameras;++i)
    {
        aiCamera* cam = pScene->mCameras[i];
        const aiNode* nd = pScene->mRootNode->FindNode(cam->mName);
        ai_assert(NULL != nd);

        // multiply all properties of the camera with the absolute
        // transformation of the corresponding node
        cam->mPosition = nd->mTransformation * cam->mPosition;
        cam->mLookAt   = aiMatrix3x3( nd->mTransformation ) * cam->mLookAt;
        cam->mUp       = aiMatrix3x3( nd->mTransformation ) * cam->mUp;
    }

    for (unsigned int i = 0; i < pScene->mNumLights;++i)
    {
        aiLight* l = pScene->mLights[i];
        const aiNode* nd = pScene->mRootNode->FindNode(l->mName);
        ai_assert(NULL != nd);

        // multiply all properties of the camera with the absolute
        // transformation of the corresponding node
        l->mPosition   = nd->mTransformation * l->mPosition;
        l->mDirection  = aiMatrix3x3( nd->mTransformation ) * l->mDirection;
        l->mUp         = aiMatrix3x3( nd->mTransformation ) * l->mUp;
    }

    if( !configKeepHierarchy ) {

        // now delete all nodes in the scene and build a new
        // flat node graph with a root node and some level 1 children
        aiNode* newRoot = new aiNode();
        newRoot->mName = pScene->mRootNode->mName;
        delete pScene->mRootNode;
        pScene->mRootNode = newRoot;

        if (1 == pScene->mNumMeshes && !pScene->mNumLights && !pScene->mNumCameras)
        {
            pScene->mRootNode->mNumMeshes = 1;
            pScene->mRootNode->mMeshes = new unsigned int[1];
            pScene->mRootNode->mMeshes[0] = 0;
        }
        else
        {
            pScene->mRootNode->mNumChildren = pScene->mNumMeshes+pScene->mNumLights+pScene->mNumCameras;
            aiNode** nodes = pScene->mRootNode->mChildren = new aiNode*[pScene->mRootNode->mNumChildren];

            // generate mesh nodes
            for (unsigned int i = 0; i < pScene->mNumMeshes;++i,++nodes)
            {
                aiNode* pcNode = new aiNode();
                *nodes = pcNode;
                pcNode->mParent = pScene->mRootNode;
                pcNode->mName = pScene->mMeshes[i]->mName;

                // setup mesh indices
                pcNode->mNumMeshes = 1;
                pcNode->mMeshes = new unsigned int[1];
                pcNode->mMeshes[0] = i;
            }
            // generate light nodes
            for (unsigned int i = 0; i < pScene->mNumLights;++i,++nodes)
            {
                aiNode* pcNode = new aiNode();
                *nodes = pcNode;
                pcNode->mParent = pScene->mRootNode;
                pcNode->mName.length = ai_snprintf(pcNode->mName.data, MAXLEN, "light_%u",i);
                pScene->mLights[i]->mName = pcNode->mName;
            }
            // generate camera nodes
            for (unsigned int i = 0; i < pScene->mNumCameras;++i,++nodes)
            {
                aiNode* pcNode = new aiNode();
                *nodes = pcNode;
                pcNode->mParent = pScene->mRootNode;
                pcNode->mName.length = ::ai_snprintf(pcNode->mName.data,MAXLEN,"cam_%u",i);
                pScene->mCameras[i]->mName = pcNode->mName;
            }
        }
    }
    else {
        // ... and finally set the transformation matrix of all nodes to identity
        MakeIdentityTransform(pScene->mRootNode);
    }

    if (configNormalize) {
        // compute the boundary of all meshes
        aiVector3D min,max;
        MinMaxChooser<aiVector3D> ()(min,max);

        for (unsigned int a = 0; a <  pScene->mNumMeshes; ++a) {
            aiMesh* m = pScene->mMeshes[a];
            for (unsigned int i = 0; i < m->mNumVertices;++i) {
                min = std::min(m->mVertices[i],min);
                max = std::max(m->mVertices[i],max);
            }
        }

        // find the dominant axis
        aiVector3D d = max-min;
        const ai_real div = std::max(d.x,std::max(d.y,d.z))*ai_real( 0.5);

        d = min + d * (ai_real)0.5;
        for (unsigned int a = 0; a <  pScene->mNumMeshes; ++a) {
            aiMesh* m = pScene->mMeshes[a];
            for (unsigned int i = 0; i < m->mNumVertices;++i) {
                m->mVertices[i] = (m->mVertices[i]-d)/div;
            }
        }
    }

    // print statistics
    if (!DefaultLogger::isNullLogger()) {
        ASSIMP_LOG_DEBUG("PretransformVerticesProcess finished");

        ASSIMP_LOG_INFO_F("Removed ", iOldNodes, " nodes and ", iOldAnimationChannels, " animation channels (", 
            CountNodes(pScene->mRootNode) ," output nodes)" );
        ASSIMP_LOG_INFO_F("Kept ", pScene->mNumLights, " lights and ", pScene->mNumCameras, " cameras." );
        ASSIMP_LOG_INFO_F("Moved ", iOldMeshes, " meshes to WCS (number of output meshes: ", pScene->mNumMeshes, ")");
    }
}